

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_mfp.h
# Opt level: O0

member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *
dlib::make_mfp<dlib::open_file_box_helper::box_win,dlib::toggle_button&>
          (box_win *object,mfp_pointer_type cb)

{
  mfp_pointer_type in_RDX;
  box_win *in_RDI;
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *unaff_retaddr;
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *temp;
  box_win *object_00;
  
  object_00 = in_RDI;
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void>::member_function_pointer
            ((member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *)0x485b22);
  member_function_pointer<dlib::toggle_button_&,_void,_void,_void>::
  set<dlib::open_file_box_helper::box_win>(unaff_retaddr,object_00,in_RDX);
  return (member_function_pointer<dlib::toggle_button_&,_void,_void,_void> *)in_RDI;
}

Assistant:

member_function_pointer<A1> make_mfp (
        T& object,
        void (T::*cb)(A1)
    )
    {
        member_function_pointer<A1> temp;
        temp.set(object, cb);
        return temp;
    }